

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatMem.c
# Opt level: O2

void Msat_MmStepStop(Msat_MmStep_t *p,int fVerbose)

{
  Msat_MmFixed_t **__ptr;
  int i;
  long lVar1;
  
  for (lVar1 = 0; __ptr = p->pMems, lVar1 < p->nMems; lVar1 = lVar1 + 1) {
    Msat_MmFixedStop(__ptr[lVar1],fVerbose);
  }
  if (__ptr != (Msat_MmFixed_t **)0x0) {
    free(__ptr);
    p->pMems = (Msat_MmFixed_t **)0x0;
  }
  free(p->pMap);
  free(p);
  return;
}

Assistant:

void Msat_MmStepStop( Msat_MmStep_t * p, int fVerbose )
{
    int i;
    for ( i = 0; i < p->nMems; i++ )
        Msat_MmFixedStop( p->pMems[i], fVerbose );
    ABC_FREE( p->pMems );
    ABC_FREE( p->pMap );
    ABC_FREE( p );
}